

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cm_control.c
# Opt level: O0

void INT_CMCondition_fail(CManager cm,int condition)

{
  CManager cm_00;
  long in_RDI;
  CMCondition cond;
  CMControlList cl;
  CMCondition in_stack_ffffffffffffffd8;
  undefined8 in_stack_ffffffffffffffe0;
  CMControlList cl_00;
  
  cl_00 = *(CMControlList *)(in_RDI + 0x20);
  cm_00 = (CManager)CMCondition_find(cl_00,(int)((ulong)in_stack_ffffffffffffffe0 >> 0x20));
  if (cm_00 != (CManager)0x0) {
    *(undefined4 *)((long)&cm_00->control_module_choice + 4) = 1;
    CMCondition_trigger(cm_00,in_stack_ffffffffffffffd8,(CMControlList)0x129abc);
    if (cl_00->cond_polling != 0) {
      CMwake_server_thread(cm_00);
    }
  }
  return;
}

Assistant:

extern void
INT_CMCondition_fail(CManager cm, int condition)
{
    CMControlList cl = cm->control_list;
    CMCondition cond = CMCondition_find(cl, condition);
    if (!cond) return;
    cond->failed = 1;
    CMCondition_trigger(cm, cond, cm->control_list);

    if (cl->cond_polling) {
	/* wake the server thread in case we're not him */
	CMwake_server_thread(cm);
    }
}